

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O2

string * __thiscall
PyreNet::ActivationFactory::toString_abi_cxx11_
          (string *__return_storage_ptr__,ActivationFactory *this,activationType activation)

{
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "step";
    __a = &local_15;
    break;
  case 1:
    __s = "linear";
    __a = &local_14;
    break;
  case 2:
    __s = "sigmoid";
    __a = &local_12;
    break;
  case 3:
    __s = "tanh";
    __a = &local_13;
    break;
  case 4:
    __s = "relu";
    __a = &local_11;
    break;
  default:
    puVar1 = (undefined8 *)
             __cxa_allocate_exception(8,this,CONCAT44(in_register_00000014,activation));
    *puVar1 = std::operator>>;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ActivationFactory::toString(LayerDefinition::activationType activation) {
        switch (activation) {
            case LayerDefinition::step: {
                return "step";
            }
            case LayerDefinition::linear: {
                return "linear";
            }
            case LayerDefinition::tanh: {
                return "tanh";
            }
            case LayerDefinition::sigmoid: {
                return "sigmoid";
            }
            case LayerDefinition::relu: {
                return "relu";
            }
            default: {
                throw std::exception();
            }
        }
    }